

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write_int<__int128>(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    *this,__int128 value,format_specs *spec)

{
  undefined1 value_00 [16];
  long in_RCX;
  undefined1 local_68 [8];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> w;
  
  value_00._8_8_ = w.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  value_00._0_8_ = local_68;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::int_writer<__int128>
            ((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *)local_68
             ,(buffer_appender<char>)
              (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
             (locale_ref)(this->locale_).locale_,(__int128)value_00,spec);
  handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>&>
            (*(char *)(in_RCX + 8),
             (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *)local_68
            );
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)local_68;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }